

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O2

char * Am_Enum_To_String_Helper(Am_ID_Tag type,long value)

{
  int iVar1;
  Am_Type_Support *pAVar2;
  undefined4 extraout_var;
  Am_Value v;
  Am_Value_Type in_stack_ffffffffffffffde;
  Am_Value local_20;
  char *pcVar3;
  
  pAVar2 = Am_Find_Support(in_stack_ffffffffffffffde);
  if (pAVar2 == (Am_Type_Support *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    local_20.type = type;
    local_20.value.long_value = value;
    iVar1 = (*pAVar2->_vptr_Am_Type_Support[1])(pAVar2);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
    Am_Value::~Am_Value(&local_20);
  }
  return pcVar3;
}

Assistant:

const char *
Am_Enum_To_String_Helper(Am_ID_Tag type, long value)
{
  Am_Type_Support *support = Am_Find_Support(type);
  if (support) {
    Am_Value v(value, type);
    return support->To_String(v);
  } else
    return nullptr;
}